

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg4.hpp
# Opt level: O2

void __thiscall trng::mrg4::jump(mrg4 *this,unsigned_long_long s)

{
  uint i;
  uint s_00;
  
  s_00 = 0;
  if (s < 0x10) {
    for (; s_00 < (uint)s; s_00 = s_00 + 1) {
      step(this);
    }
  }
  else {
    for (; s != 0; s = s >> 1) {
      if ((s & 1) != 0) {
        jump2(this,s_00);
      }
      s_00 = s_00 + 1;
    }
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void mrg4::jump(unsigned long long s) {
    if (s < 16) {
      for (unsigned int i{0}; i < s; ++i)
        step();
    } else {
      unsigned int i(0);
      while (s > 0) {
        if (s % 2 == 1)
          jump2(i);
        ++i;
        s >>= 1u;
      }
    }
  }